

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O0

void __thiscall SymbolData::startModule(SymbolData *this,AssemblerFile *file)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 local_88 [8];
  SymDataModule module;
  size_t i;
  AssemblerFile *file_local;
  SymbolData *this_local;
  
  module.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  while( true ) {
    sVar1 = module.data._M_t._M_impl.super__Rb_tree_header._M_node_count;
    sVar2 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::size(&this->modules);
    if (sVar2 <= sVar1) {
      SymDataModule::SymDataModule((SymDataModule *)local_88);
      local_88 = (undefined1  [8])file;
      std::vector<SymDataModule,_std::allocator<SymDataModule>_>::push_back
                (&this->modules,(SymDataModule *)local_88);
      sVar2 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::size(&this->modules);
      this->currentModule = (int)sVar2 + -1;
      SymDataModule::~SymDataModule((SymDataModule *)local_88);
      return;
    }
    pvVar3 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                       (&this->modules,module.data._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    if (pvVar3->file == file) break;
    module.data._M_t._M_impl.super__Rb_tree_header._M_node_count =
         module.data._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  this->currentModule = (int)module.data._M_t._M_impl.super__Rb_tree_header._M_node_count;
  return;
}

Assistant:

void SymbolData::startModule(AssemblerFile* file)
{
	for (size_t i = 0; i < modules.size(); i++)
	{
		if (modules[i].file == file)
		{
			currentModule = (int)i;
			return;
		}
	}

	SymDataModule module;
	module.file = file;
	modules.push_back(module);
	currentModule = (int)modules.size()-1;
}